

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

uchar * kex_agree_instr(uchar *haystack,unsigned_long haystack_len,uchar *needle,
                       unsigned_long needle_len)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uchar *local_38;
  uchar *s;
  unsigned_long needle_len_local;
  uchar *needle_local;
  unsigned_long haystack_len_local;
  uchar *haystack_local;
  
  if (haystack_len < needle_len) {
    haystack_local = (uchar *)0x0;
  }
  else {
    iVar2 = strncmp((char *)haystack,(char *)needle,needle_len);
    local_38 = haystack;
    if ((iVar2 != 0) ||
       ((haystack_local = haystack, needle_len != haystack_len && (haystack[needle_len] != ',')))) {
      while( true ) {
        pcVar3 = strchr((char *)local_38,0x2c);
        bVar1 = false;
        if (pcVar3 != (char *)0x0) {
          bVar1 = needle_len < haystack_len - ((long)pcVar3 - (long)haystack);
        }
        if (!bVar1) break;
        local_38 = (uchar *)(pcVar3 + 1);
        iVar2 = strncmp((char *)local_38,(char *)needle,needle_len);
        if (iVar2 == 0) {
          if (local_38 + (needle_len - (long)haystack) == (uchar *)haystack_len) {
            return local_38;
          }
          if (local_38[needle_len] == ',') {
            return local_38;
          }
        }
      }
      haystack_local = (uchar *)0x0;
    }
  }
  return haystack_local;
}

Assistant:

static unsigned char *
kex_agree_instr(unsigned char *haystack, unsigned long haystack_len,
                const unsigned char *needle, unsigned long needle_len)
{
    unsigned char *s;

    /* Haystack too short to bother trying */
    if (haystack_len < needle_len) {
        return NULL;
    }

    /* Needle at start of haystack */
    if ((strncmp((char *) haystack, (char *) needle, needle_len) == 0) &&
        (needle_len == haystack_len || haystack[needle_len] == ',')) {
        return haystack;
    }

    s = haystack;
    /* Search until we run out of comas or we run out of haystack,
       whichever comes first */
    while ((s = (unsigned char *) strchr((char *) s, ','))
           && ((haystack_len - (s - haystack)) > needle_len)) {
        s++;
        /* Needle at X position */
        if ((strncmp((char *) s, (char *) needle, needle_len) == 0) &&
            (((s - haystack) + needle_len) == haystack_len
             || s[needle_len] == ',')) {
            return s;
        }
    }

    return NULL;
}